

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::do_actual_learning<false>(cb_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  reference ppeVar1;
  label *in_RDX;
  multi_ex *in_RSI;
  long in_RDI;
  cb_class cVar2;
  uint64_t in_stack_00000038;
  v_array<COST_SENSITIVE::label> *in_stack_00000040;
  label *in_stack_00000048;
  v_array<CB::label> *in_stack_00000050;
  multi_ex *in_stack_00000058;
  multi_learner *in_stack_00000060;
  size_t in_stack_00000070;
  undefined8 local_28;
  undefined8 local_20;
  
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)in_RDX,0);
  *(uint64_t *)(in_RDI + 0xf8) = ((*ppeVar1)->super_example_predict).ft_offset;
  cVar2 = get_observed_cost((multi_ex *)in_stack_00000040);
  local_28 = cVar2._0_8_;
  *(undefined8 *)(in_RDI + 0x60) = local_28;
  local_20 = cVar2._8_8_;
  *(undefined8 *)(in_RDI + 0x68) = local_20;
  GEN_CS::gen_cs_test_example(in_RSI,in_RDX);
  GEN_CS::call_cs_ldf<false>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             in_stack_00000040,in_stack_00000038,in_stack_00000070);
  return;
}

Assistant:

void do_actual_learning(cb_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  data.offset = ec_seq[0]->ft_offset;
  data.gen_cs.known_cost = get_observed_cost(ec_seq);  // need to set for test case
  if (is_learn && !test_adf_sequence(ec_seq))
  {
    /*	v_array<float> temp_scores;
    temp_scores = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_scores.push_back(data.ec_seq[0]->pred.a_s[i].score);*/
    switch (data.gen_cs.cb_type)
    {
      case CB_TYPE_IPS:
        learn_IPS(data, base, ec_seq);
        break;
      case CB_TYPE_DR:
        learn_DR(data, base, ec_seq);
        break;
      case CB_TYPE_DM:
        learn_DM(data, base, ec_seq);
        break;
      case CB_TYPE_MTR:
        if (data.no_predict)
          learn_MTR<false>(data, base, ec_seq);
        else
          learn_MTR<true>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown cb_type specified for contextual bandit learning: " << data.gen_cs.cb_type);
    }

    /*      for (size_t i = 0; i < temp_scores.size(); i++)
    if (temp_scores[i] != data.ec_seq[0]->pred.a_s[i].score)
      cout << "problem! " << temp_scores[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
    data.ec_seq[0]->pred.a_s[i].action << endl; temp_scores.delete_v();*/
  }
  else
  {
    gen_cs_test_example(ec_seq, data.cs_labels);  // create test labels.
    call_cs_ldf<false>(base, ec_seq, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset);
  }
}